

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::allocCallbackFailTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  string *psVar1;
  PlatformInterface *pPVar2;
  bool bVar3;
  int iVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Resources res;
  Environment rootEnv;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  AllocationCallbackRecorder resCallbacks;
  Resources local_a50;
  Environment local_a20;
  Environment local_9e8;
  Move<vk::Handle<(vk::HandleType)16>_> local_9a8;
  undefined1 local_988 [8];
  Deleter<vk::Handle<(vk::HandleType)16>_> aDStack_980 [4];
  ios_base local_910 [272];
  DeterministicFailAllocator local_800;
  AllocationCallbackRecorder local_7b0;
  AllocationCallbackRecorder local_750;
  EnvClone local_6f0;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_750,pVVar5,0x80);
  pPVar2 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  local_a20.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_a20.programBinaries = context->m_progCollection;
  local_a20.allocationCallbacks =
       &local_750.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_a20.maxResourceConsumers = 1;
  local_a20.vkp = pPVar2;
  local_a20.vkd = pDVar6;
  local_a20.device = pVVar7;
  tcu::CommandLine::getTestIterationCount(context->m_testCtx->m_cmdLine);
  iVar4 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_988 = (undefined1  [8])((ulong)(iVar4 - 1U) | 0x300000000);
  EnvClone::EnvClone(&local_6f0,&local_a20,(Parameters *)local_988,iVar4 - 1U);
  PipelineLayout::Resources::Resources(&local_a50,&local_6f0.env,params);
  psVar1 = &__return_storage_ptr__->m_description;
  paVar8 = &(__return_storage_ptr__->m_description).field_2;
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::DeterministicFailAllocator::DeterministicFailAllocator
            (&local_800,pVVar5,MODE_COUNT_AND_FAIL,0);
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            (&local_7b0,&local_800.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
            );
  local_9e8.vkp = local_6f0.env.vkp;
  local_9e8.vkd = local_6f0.env.vkd;
  local_9e8.device = local_6f0.env.device;
  local_9e8.queueFamilyIndex = local_6f0.env.queueFamilyIndex;
  local_9e8.programBinaries = local_6f0.env.programBinaries;
  local_9e8.allocationCallbacks =
       &local_7b0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_9e8.maxResourceConsumers = local_6f0.env.maxResourceConsumers;
  local_988 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_980);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aDStack_980,"Trying to create object with ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)aDStack_980);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980," allocation",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980,"s",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aDStack_980," passing",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_988,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_980);
  std::ios_base::~ios_base(local_910);
  PipelineLayout::create
            (&local_9a8,&local_9e8,
             (Resources *)
             local_a50.pSetLayouts.
             super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (Parameters *)
             local_a50.pSetLayouts.
             super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  aDStack_980[0].m_device =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  aDStack_980[0].m_allocator =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_988 = (undefined1  [8])
              local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  aDStack_980[0].m_deviceIface =
       local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  if (local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (aDStack_980,
               (VkPipelineLayout)
               local_9a8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_7b0,0);
  if (bVar3) {
    local_988 = (undefined1  [8])context->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)aDStack_980);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)aDStack_980,"Object construction succeeded! ",0x1f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_988,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)aDStack_980);
    std::ios_base::~ios_base(local_910);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7b0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_800.super_ChainedAllocator);
    bVar3 = true;
  }
  else {
    local_988 = (undefined1  [8])&aDStack_980[0].m_device;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_988,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar1,local_988,
               (undefined1 *)
               ((long)local_988 + (long)&(aDStack_980[0].m_deviceIface)->_vptr_DeviceInterface));
    if (local_988 != (undefined1  [8])&aDStack_980[0].m_device) {
      operator_delete((void *)local_988,(ulong)(aDStack_980[0].m_device + 1));
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_7b0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_800.super_ChainedAllocator);
    bVar3 = false;
  }
  if ((Resources *)
      local_a50.pSetLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Resources *)0x0) {
    operator_delete(local_a50.pSetLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a50.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a50.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ::~vector(&local_a50.descriptorSetLayouts);
  ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
  if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
  if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  if (bVar3) {
    bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_750,0);
    if (bVar3) {
      local_6f0.deviceRes.instance._0_8_ =
           &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,"Allocation callbacks not called","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                 local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_6f0.deviceRes.instance._0_8_);
    }
    else {
      local_6f0.deviceRes.instance._0_8_ =
           &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar1,local_6f0.deviceRes.instance._0_8_,
                 local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object
                 + local_6f0.deviceRes.instance._0_8_);
    }
    if ((Deleter<vk::VkInstance_s_*> *)local_6f0.deviceRes.instance._0_8_ !=
        &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter) {
      operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                      (ulong)(local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                              m_data.deleter.m_destroyInstance + 1));
    }
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_750);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocCallbackFailTest (Context& context, typename Object::Parameters params)
{
	AllocationCallbackRecorder			resCallbacks		(getSystemAllocator(), 128);
	const Environment					rootEnv				(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 resCallbacks.getCallbacks(),
															 1u);
	deUint32							numPassingAllocs	= 0;
	const deUint32						cmdLineIterCount	= (deUint32)context.getTestContext().getCommandLine().getTestIterationCount();
	const deUint32						maxTries			= cmdLineIterCount != 0 ? cmdLineIterCount : getOomIterLimit<Object>();

	{
		const EnvClone						resEnv	(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res		(resEnv.env, params);

		// Iterate over test until object allocation succeeds
		for (; numPassingAllocs < maxTries; ++numPassingAllocs)
		{
			DeterministicFailAllocator			objAllocator(getSystemAllocator(),
															 DeterministicFailAllocator::MODE_COUNT_AND_FAIL,
															 numPassingAllocs);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(resEnv.env.vkp,
															 resEnv.env.vkd,
															 resEnv.env.device,
															 resEnv.env.queueFamilyIndex,
															 resEnv.env.programBinaries,
															 recorder.getCallbacks(),
															 resEnv.env.maxResourceConsumers);
			bool								createOk	= false;

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create object with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			try
			{
				Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));
				createOk = true;
			}
			catch (const vk::OutOfMemoryError& e)
			{
				if (e.getError() != VK_ERROR_OUT_OF_HOST_MEMORY)
				{
					context.getTestContext().getLog() << e;
					return tcu::TestStatus::fail("Got invalid error code");
				}
			}

			if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
				return tcu::TestStatus::fail("Invalid allocation callback");

			if (createOk)
			{
				context.getTestContext().getLog()
					<< TestLog::Message << "Object construction succeeded! " << TestLog::EndMessage;
				break;
			}
		}
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	if (numPassingAllocs == 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	else if (numPassingAllocs == maxTries)
		return tcu::TestStatus(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Max iter count reached; OOM testing incomplete");
	else
		return tcu::TestStatus::pass("Ok");
}